

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxUnicode.cpp
# Opt level: O0

String * Jinx::Impl::ConvertUtf16ToUtf8(String *__return_storage_ptr__,StringU16 *utf16_string)

{
  char32_t utf32CodePoint_00;
  char16_t *pcVar1;
  size_type sVar2;
  size_type __res;
  size_t outBufferCount;
  size_t local_50;
  size_t numOut;
  char32_t utf32CodePoint;
  char outBuffer [5];
  char16_t *cInStrEnd;
  char16_t *cInStr;
  StringU16 *utf16_string_local;
  String *outString;
  
  pcVar1 = std::__cxx11::
           basic_string<char16_t,_std::char_traits<char16_t>,_Jinx::Allocator<char16_t>_>::c_str
                     (utf16_string);
  sVar2 = std::__cxx11::
          basic_string<char16_t,_std::char_traits<char16_t>,_Jinx::Allocator<char16_t>_>::size
                    (utf16_string);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::basic_string
            (__return_storage_ptr__);
  __res = std::__cxx11::
          basic_string<char16_t,_std::char_traits<char16_t>,_Jinx::Allocator<char16_t>_>::size
                    (utf16_string);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::reserve
            (__return_storage_ptr__,__res);
  numOut._0_4_ = L'\0';
  local_50 = 0;
  cInStrEnd = pcVar1;
  while (*cInStrEnd != L'\0') {
    ConvertUtf16ToUtf32(cInStrEnd,(uint32_t)((long)pcVar1 + (sVar2 * 2 - (long)cInStrEnd) >> 1),
                        (char32_t *)&numOut,&local_50);
    utf32CodePoint_00 = (char32_t)numOut;
    cInStrEnd = cInStrEnd + local_50;
    outBufferCount = std::size<char,5ul>((char (*) [5])((long)&numOut + 7));
    ConvertUtf32ToUtf8(utf32CodePoint_00,(char *)((long)&numOut + 7),outBufferCount,&local_50);
    *(undefined1 *)((long)&numOut + local_50 + 7) = 0;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator+=
              (__return_storage_ptr__,(char *)((long)&numOut + 7));
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t String ConvertUtf16ToUtf8(const StringU16 & utf16_string)
	{
		const char16_t * cInStr = utf16_string.c_str();
		const char16_t * cInStrEnd = cInStr + utf16_string.size();
		String outString;
		outString.reserve(utf16_string.size());
		char outBuffer[5];
		char32_t utf32CodePoint = 0;
		size_t numOut = 0;
		while (*cInStr != 0)
		{
			Impl::ConvertUtf16ToUtf32(cInStr, (uint32_t)(cInStrEnd - cInStr), &utf32CodePoint, &numOut);
			cInStr += numOut;
			Impl::ConvertUtf32ToUtf8(utf32CodePoint, outBuffer, std::size(outBuffer), &numOut);
			outBuffer[numOut] = 0;
			outString += outBuffer;
		}
		return outString;
	}